

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad.c
# Opt level: O0

uint highbd_sad(uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int width,int height)

{
  int iVar1;
  uint16_t *b;
  uint16_t *a;
  uint sad;
  int x;
  int y;
  int height_local;
  int width_local;
  int b_stride_local;
  uint8_t *b8_local;
  int a_stride_local;
  uint8_t *a8_local;
  
  sad = 0;
  a = (uint16_t *)((long)a8 << 1);
  b = (uint16_t *)((long)b8 << 1);
  for (y = 0; y < height; y = y + 1) {
    for (x = 0; x < width; x = x + 1) {
      iVar1 = (uint)a[x] - (uint)b[x];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      sad = iVar1 + sad;
    }
    a = a + a_stride;
    b = b + b_stride;
  }
  return sad;
}

Assistant:

static inline unsigned int highbd_sad(const uint8_t *a8, int a_stride,
                                      const uint8_t *b8, int b_stride,
                                      int width, int height) {
  int y, x;
  unsigned int sad = 0;
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      sad += abs(a[x] - b[x]);
    }

    a += a_stride;
    b += b_stride;
  }
  return sad;
}